

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall
c4::yml::Tree::_next_node_modify(Tree *this,lookup_result *r,_lookup_path_token *parent)

{
  undefined1 uVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  bool bVar14;
  size_t sVar15;
  csubstr *pcVar16;
  NodeData *pNVar17;
  char *pcVar18;
  undefined8 extraout_RAX;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  basic_substring<const_char> *pbVar22;
  size_t sVar23;
  NodeType_e f;
  byte bVar24;
  csubstr str;
  csubstr cVar25;
  basic_substring<const_char> bVar26;
  char msg [46];
  size_t pos;
  basic_substring<const_char> local_248;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined1 uStack_230;
  undefined1 uStack_22f;
  undefined2 uStack_22e;
  undefined1 uStack_22c;
  undefined1 uStack_22b;
  undefined1 uStack_22a;
  undefined1 uStack_229;
  undefined1 uStack_228;
  undefined1 uStack_227;
  undefined1 uStack_226;
  undefined1 uStack_225;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined1 uStack_220;
  undefined1 uStack_21f;
  undefined4 uStack_21e;
  undefined2 uStack_21a;
  undefined2 local_200;
  undefined1 local_1fe;
  _lookup_path_token *local_1f0;
  basic_substring<const_char> local_1e8;
  _lookup_path_token local_1d8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  char *pcStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar24 = 0;
  _next_token(&local_1d8,this,r,parent);
  sVar23 = 0xffffffffffffffff;
  sVar15 = local_1d8.value.len;
  switch(local_1d8.type.type) {
  case NOTYPE:
    goto switchD_001d1f12_caseD_0;
  default:
    _next_node_modify();
    __clang_call_terminate(extraout_RAX);
  case KEY:
    if ((((char *)local_1d8.value.len == (char *)0x0) || (*local_1d8.value.str != '[')) ||
       ((local_1d8.value.str + -1)[local_1d8.value.len] != ']')) {
      pcVar18 = "check failed: (token.value.begins_with(\'[\') && token.value.ends_with(\']\'))";
      pbVar22 = &local_248;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        pbVar22->str = *(char **)pcVar18;
        pcVar18 = pcVar18 + ((ulong)bVar24 * -2 + 1) * 8;
        pbVar22 = (basic_substring<const_char> *)&pbVar22[-(ulong)bVar24].len;
      }
      local_1fe = 0;
      local_200 = 0x2929;
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_148 = 0;
      uStack_140 = 26999;
      local_138 = 0;
      pcStack_130 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_128 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(26999) << 0x40);
      LVar9.name.str._0_4_ = 0x214288;
      LVar9.super_LineCol.offset = auVar4._0_8_;
      LVar9.super_LineCol.line = auVar4._8_8_;
      LVar9.super_LineCol.col = auVar4._16_8_;
      LVar9.name.str._4_4_ = 0;
      LVar9.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_248,0x4b,LVar9,(this->m_callbacks).m_user_data);
      if ((char *)sVar15 == (char *)0x0) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        handle_error(0x214335,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1560,"left >= 0 && left <= len");
      }
    }
    basic_substring<const_char>::basic_substring
              (&local_248,local_1d8.value.str + 1,(size_t)(sVar15 + -2));
    local_1e8.str = (char *)CONCAT44(local_248.str._4_4_,local_248.str._0_4_);
    bVar26 = basic_substring<const_char>::triml(&local_1e8,' ');
    local_248.str._0_4_ = bVar26.str._0_4_;
    local_248.str._4_4_ = bVar26.str._4_4_;
    local_248.len._0_4_ = (undefined4)bVar26.len;
    local_248.len._4_4_ = bVar26.len._4_4_;
    local_1d8.value = basic_substring<const_char>::trimr(&local_248,' ');
    str.len = (size_t)&local_1e8;
    str.str = (char *)local_1d8.value.len;
    bVar14 = atou<unsigned_long>((c4 *)local_1d8.value.str,str,(unsigned_long *)&local_1e8);
    if (!bVar14) {
      return 0xffffffffffffffff;
    }
    uVar20 = r->closest;
    if ((uVar20 == 0xffffffffffffffff) || (this->m_cap <= uVar20)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4b86;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[uVar20].m_type.type & (STREAM|MAP)) == NOTYPE) {
      pNVar17 = _p(this,r->closest);
      if (((pNVar17->m_type).type & KEY) == NOTYPE) {
        _clear_type(this,r->closest);
        to_seq(this,r->closest,0);
      }
      else {
        pcVar16 = key(this,r->closest);
        cVar25 = *pcVar16;
        _clear_type(this,r->closest);
        to_seq(this,r->closest,cVar25,0);
      }
    }
    uVar20 = r->closest;
    if ((uVar20 == 0xffffffffffffffff) || (this->m_cap <= uVar20)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4b86;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[uVar20].m_type.type & (STREAM|MAP)) == NOTYPE) {
      uStack_228 = 0x6c;
      uStack_227 = 0x6f;
      uStack_226 = 0x73;
      uStack_225 = 0x65;
      uStack_224 = 0x7473;
      uStack_222 = 0x2929;
      uStack_220 = 0;
      local_238 = 0x6f635f73;
      uStack_234 = 0x6961746e;
      uStack_230 = 0x6e;
      uStack_22f = 0x65;
      uStack_22e = 0x2872;
      uStack_22c = 0x72;
      uStack_22b = 0x2d;
      uStack_22a = 0x3e;
      uStack_229 = 99;
      local_248.str._0_4_ = 0x63656863;
      local_248.str._4_4_ = 0x6166206b;
      local_248.len._0_4_ = 0x64656c69;
      local_248.len._4_4_ = 0x6928203a;
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_170 = 0;
      uStack_168 = 0x698a;
      local_160 = 0;
      pcStack_158 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_150 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x698a) << 0x40);
      LVar11.name.str._0_4_ = 0x214288;
      LVar11.super_LineCol.offset = auVar4._0_8_;
      LVar11.super_LineCol.line = auVar4._8_8_;
      LVar11.super_LineCol.col = auVar4._16_8_;
      LVar11.name.str._4_4_ = 0;
      LVar11.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_248,0x29,LVar11,(this->m_callbacks).m_user_data)
      ;
    }
    sVar23 = child(this,r->closest,(size_t)local_1e8.str);
    if (sVar23 == 0xffffffffffffffff) {
      pcVar18 = (char *)num_children(this,r->closest);
      if (local_1e8.str < pcVar18) {
        uStack_228 = 0x6c;
        uStack_227 = 0x6f;
        uStack_226 = 0x73;
        uStack_225 = 0x65;
        uStack_224 = 0x7473;
        uStack_222 = 0x2029;
        uStack_220 = 0x3c;
        uStack_21f = 0x3d;
        uStack_21e = 0x78646920;
        uStack_21a = 0x29;
        local_238 = 0x635f6d75;
        uStack_234 = 0x646c6968;
        uStack_230 = 0x72;
        uStack_22f = 0x65;
        uStack_22e = 0x286e;
        uStack_22c = 0x72;
        uStack_22b = 0x2d;
        uStack_22a = 0x3e;
        uStack_229 = 99;
        local_248.str._0_4_ = 0x63656863;
        local_248.str._4_4_ = 0x6166206b;
        local_248.len._0_4_ = 0x64656c69;
        local_248.len._4_4_ = 0x6e28203a;
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_198 = 0;
        uStack_190 = 0x698e;
        local_188 = 0;
        pcStack_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_178 = 0x65;
        auVar4 = ZEXT1224(ZEXT412(0x698e) << 0x40);
        LVar12.name.str._0_4_ = 0x214288;
        LVar12.super_LineCol.offset = auVar4._0_8_;
        LVar12.super_LineCol.line = auVar4._8_8_;
        LVar12.super_LineCol.col = auVar4._16_8_;
        LVar12.name.str._4_4_ = 0;
        LVar12.name.len = 0x65;
        (*(this->m_callbacks).m_error)
                  ((char *)&local_248,0x30,LVar12,(this->m_callbacks).m_user_data);
      }
      local_1f0 = parent;
      pcVar18 = (char *)num_children(this,r->closest);
      sVar23 = 0xffffffffffffffff;
      parent = local_1f0;
      if (pcVar18 <= local_1e8.str) {
        do {
          sVar15 = r->closest;
          uVar20 = this->m_cap;
          if (sVar15 < uVar20 && sVar15 != 0xffffffffffffffff) {
            pNVar17 = this->m_buf;
            uVar21 = pNVar17[sVar15].m_last_child;
LAB_001d347c:
            if (uVar20 <= sVar15) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
                pcVar2 = (code *)swi(3);
                sVar15 = (*pcVar2)();
                return sVar15;
              }
              local_248.str._0_4_ = 0;
              local_248.str._4_4_ = 0;
              local_248.len._0_4_ = 0x4b86;
              local_248.len._4_4_ = 0;
              local_238 = 0;
              uStack_234 = 0;
              uStack_230 = 0x88;
              uStack_22f = 0x42;
              uStack_22e = 0x21;
              uStack_22c = 0;
              uStack_22b = 0;
              uStack_22a = 0;
              uStack_229 = 0;
              uStack_228 = 0x65;
              uStack_227 = 0;
              uStack_226 = 0;
              uStack_225 = 0;
              uStack_224 = 0;
              uStack_222 = 0;
              (*(code *)PTR_error_impl_00247a78)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
              pNVar17 = this->m_buf;
            }
            uVar1 = (undefined1)pNVar17[sVar15].m_type.type;
          }
          else {
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar2 = (code *)swi(3);
              sVar15 = (*pcVar2)();
              return sVar15;
            }
            local_248.str._0_4_ = 0;
            local_248.str._4_4_ = 0;
            local_248.len._0_4_ = 0x4b83;
            local_248.len._4_4_ = 0;
            local_238 = 0;
            uStack_234 = 0;
            uStack_230 = 0x88;
            uStack_22f = 0x42;
            uStack_22e = 0x21;
            uStack_22c = 0;
            uStack_22b = 0;
            uStack_22a = 0;
            uStack_229 = 0;
            uStack_228 = 0x65;
            uStack_227 = 0;
            uStack_226 = 0;
            uStack_225 = 0;
            uStack_224 = 0;
            uStack_222 = 0;
            (*(code *)PTR_error_impl_00247a78)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
            pNVar17 = this->m_buf;
            uVar21 = pNVar17[sVar15].m_last_child;
            if (sVar15 != 0xffffffffffffffff) {
              uVar20 = this->m_cap;
              goto LAB_001d347c;
            }
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar2 = (code *)swi(3);
              sVar15 = (*pcVar2)();
              return sVar15;
            }
            local_248.str._0_4_ = 0;
            local_248.str._4_4_ = 0;
            local_248.len._0_4_ = 0x4cb1;
            local_248.len._4_4_ = 0;
            local_238 = 0;
            uStack_234 = 0;
            uStack_230 = 0x88;
            uStack_22f = 0x42;
            uStack_22e = 0x21;
            uStack_22c = 0;
            uStack_22b = 0;
            uStack_22a = 0;
            uStack_229 = 0;
            uStack_228 = 0x65;
            uStack_227 = 0;
            uStack_226 = 0;
            uStack_225 = 0;
            uStack_224 = 0;
            uStack_222 = 0;
            (*(code *)PTR_error_impl_00247a78)
                      ("check failed: parent != NONE",0x1c,
                       (anonymous_namespace)::s_default_callbacks);
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar2 = (code *)swi(3);
              sVar15 = (*pcVar2)();
              return sVar15;
            }
            local_248.str._0_4_ = 0;
            local_248.str._4_4_ = 0;
            local_248.len._0_4_ = 0x4b86;
            local_248.len._4_4_ = 0;
            local_238 = 0;
            uStack_234 = 0;
            uStack_230 = 0x88;
            uStack_22f = 0x42;
            uStack_22e = 0x21;
            uStack_22c = 0;
            uStack_22b = 0;
            uStack_22a = 0;
            uStack_229 = 0;
            uStack_228 = 0x65;
            uStack_227 = 0;
            uStack_226 = 0;
            uStack_225 = 0;
            uStack_224 = 0;
            uStack_222 = 0;
            (*(code *)PTR_error_impl_00247a78)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
            uVar1 = (undefined1)this->m_buf[-1].m_type.type;
          }
          if (((uVar1 & (STREAM|MAP)) == NOTYPE) && (bVar14 = is_root(this,sVar15), !bVar14)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar2 = (code *)swi(3);
              sVar15 = (*pcVar2)();
              return sVar15;
            }
            local_248.str._0_4_ = 0;
            local_248.str._4_4_ = 0;
            local_248.len._0_4_ = 0x4cb2;
            local_248.len._4_4_ = 0;
            local_238 = 0;
            uStack_234 = 0;
            uStack_230 = 0x88;
            uStack_22f = 0x42;
            uStack_22e = 0x21;
            uStack_22c = 0;
            uStack_22b = 0;
            uStack_22a = 0;
            uStack_229 = 0;
            uStack_228 = 0x65;
            uStack_227 = 0;
            uStack_226 = 0;
            uStack_225 = 0;
            uStack_224 = 0;
            uStack_222 = 0;
            (*(code *)PTR_error_impl_00247a78)
                      ("check failed: is_container(parent) || is_root(parent)",0x35,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if (uVar21 != 0xffffffffffffffff) {
            if (this->m_cap <= uVar21) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
                pcVar2 = (code *)swi(3);
                sVar15 = (*pcVar2)();
                return sVar15;
              }
              local_248.str._0_4_ = 0;
              local_248.str._4_4_ = 0;
              local_248.len._0_4_ = 0x4b83;
              local_248.len._4_4_ = 0;
              local_238 = 0;
              uStack_234 = 0;
              uStack_230 = 0x88;
              uStack_22f = 0x42;
              uStack_22e = 0x21;
              uStack_22c = 0;
              uStack_22b = 0;
              uStack_22a = 0;
              uStack_229 = 0;
              uStack_228 = 0x65;
              uStack_227 = 0;
              uStack_226 = 0;
              uStack_225 = 0;
              uStack_224 = 0;
              uStack_222 = 0;
              (*(code *)PTR_error_impl_00247a78)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
            }
            if (this->m_buf[uVar21].m_parent != sVar15) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
                pcVar2 = (code *)swi(3);
                sVar15 = (*pcVar2)();
                return sVar15;
              }
              local_248.str._0_4_ = 0;
              local_248.str._4_4_ = 0;
              local_248.len._0_4_ = 0x4cb3;
              local_248.len._4_4_ = 0;
              local_238 = 0;
              uStack_234 = 0;
              uStack_230 = 0x88;
              uStack_22f = 0x42;
              uStack_22e = 0x21;
              uStack_22c = 0;
              uStack_22b = 0;
              uStack_22a = 0;
              uStack_229 = 0;
              uStack_228 = 0x65;
              uStack_227 = 0;
              uStack_226 = 0;
              uStack_225 = 0;
              uStack_224 = 0;
              uStack_222 = 0;
              (*(code *)PTR_error_impl_00247a78)
                        ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                         (anonymous_namespace)::s_default_callbacks);
            }
          }
          sVar23 = _claim(this);
          _set_hierarchy(this,sVar23,sVar15,uVar21);
          if (pcVar18 < local_1e8.str) {
            uVar20 = r->closest;
            if ((uVar20 == 0xffffffffffffffff) || (this->m_cap <= uVar20)) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
                pcVar2 = (code *)swi(3);
                sVar15 = (*pcVar2)();
                return sVar15;
              }
              local_248.str._0_4_ = 0;
              local_248.str._4_4_ = 0;
              local_248.len._0_4_ = 0x4b86;
              local_248.len._4_4_ = 0;
              local_238 = 0;
              uStack_234 = 0;
              uStack_230 = 0x88;
              uStack_22f = 0x42;
              uStack_22e = 0x21;
              uStack_22c = 0;
              uStack_22b = 0;
              uStack_22a = 0;
              uStack_229 = 0;
              uStack_228 = 0x65;
              uStack_227 = 0;
              uStack_226 = 0;
              uStack_225 = 0;
              uStack_224 = 0;
              uStack_222 = 0;
              (*(code *)PTR_error_impl_00247a78)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
            }
            pNVar17 = this->m_buf;
            if ((pNVar17[uVar20].m_type.type & MAP) == NOTYPE) {
              uVar20 = r->closest;
              if ((uVar20 == 0xffffffffffffffff) || (this->m_cap <= uVar20)) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
                  pcVar2 = (code *)swi(3);
                  sVar15 = (*pcVar2)();
                  return sVar15;
                }
                local_248.str._0_4_ = 0;
                local_248.str._4_4_ = 0;
                local_248.len._0_4_ = 0x4b86;
                local_248.len._4_4_ = 0;
                local_238 = 0;
                uStack_234 = 0;
                uStack_230 = 0x88;
                uStack_22f = 0x42;
                uStack_22e = 0x21;
                uStack_22c = 0;
                uStack_22b = 0;
                uStack_22a = 0;
                uStack_229 = 0;
                uStack_228 = 0x65;
                uStack_227 = 0;
                uStack_226 = 0;
                uStack_225 = 0;
                uStack_224 = 0;
                uStack_222 = 0;
                (*(code *)PTR_error_impl_00247a78)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
                pNVar17 = this->m_buf;
              }
              if ((pNVar17[uVar20].m_type.type & SEQ) != NOTYPE) {
                to_val(this,sVar23,(csubstr)ZEXT816(0),0);
              }
            }
            else {
              to_keyval(this,sVar23,(csubstr)ZEXT816(0),(csubstr)ZEXT816(0),0);
            }
          }
          pcVar18 = pcVar18 + 1;
          parent = local_1f0;
        } while (pcVar18 <= local_1e8.str);
      }
      break;
    }
    goto LAB_001d3c4a;
  case KEYVAL:
    cVar25 = lookup_result::unresolved(r);
    if (cVar25.str != (char *)0x0 && cVar25.len != 0) {
      local_238 = 0x6e753e2d;
      uStack_234 = 0x6f736572;
      uStack_230 = 0x6c;
      uStack_22f = 0x76;
      uStack_22e = 0x6465;
      uStack_22c = 0x28;
      uStack_22b = 0x29;
      uStack_22a = 0x2e;
      uStack_229 = 0x65;
      local_248.str._0_4_ = 0x63656863;
      local_248.str._4_4_ = 0x6166206b;
      local_248.len._0_4_ = 0x64656c69;
      local_248.len._4_4_ = 0x7228203a;
      uStack_228 = 0x6d;
      uStack_227 = 0x70;
      uStack_226 = 0x74;
      uStack_225 = 0x79;
      uStack_224 = 0x2928;
      uStack_222 = 0x29;
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_f8 = 0;
      uStack_f0 = 0x6963;
      local_e8 = 0;
      pcStack_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_d8 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x6963) << 0x40);
      LVar7.name.str._0_4_ = 0x214288;
      LVar7.super_LineCol.offset = auVar4._0_8_;
      LVar7.super_LineCol.line = auVar4._8_8_;
      LVar7.super_LineCol.col = auVar4._16_8_;
      LVar7.name.str._4_4_ = 0;
      LVar7.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_248,0x28,LVar7,(this->m_callbacks).m_user_data);
    }
    uVar20 = r->closest;
    if ((uVar20 == 0xffffffffffffffff) || (this->m_cap <= uVar20)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4b86;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pNVar17 = this->m_buf;
    sVar15 = r->closest;
    if ((pNVar17[uVar20].m_type.type & MAP) == NOTYPE) {
      if ((sVar15 == 0xffffffffffffffff) || (this->m_cap <= sVar15)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4b86;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar17 = this->m_buf;
      }
      if ((pNVar17[sVar15].m_type.type & SEQ) != NOTYPE) {
        local_238 = 0x735f7369;
        uStack_234 = 0x72287165;
        uStack_230 = 0x2d;
        uStack_22f = 0x3e;
        uStack_22e = 0x6c63;
        uStack_22c = 0x6f;
        uStack_22b = 0x73;
        uStack_22a = 0x65;
        uStack_229 = 0x73;
        local_248.str._0_4_ = 0x63656863;
        local_248.str._4_4_ = 0x6166206b;
        local_248.len._0_4_ = 0x64656c69;
        local_248.len._4_4_ = 0x2128203a;
        uStack_228 = 0x74;
        uStack_227 = 0x29;
        uStack_226 = 0x29;
        uStack_225 = 0;
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_120 = 0;
        uStack_118 = 0x696c;
        local_110 = 0;
        pcStack_108 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_100 = 0x65;
        auVar4 = ZEXT1224(ZEXT412(0x696c) << 0x40);
        LVar8.name.str._0_4_ = 0x214288;
        LVar8.super_LineCol.offset = auVar4._0_8_;
        LVar8.super_LineCol.line = auVar4._8_8_;
        LVar8.super_LineCol.col = auVar4._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_callbacks).m_error)
                  ((char *)&local_248,0x24,LVar8,(this->m_callbacks).m_user_data);
      }
      sVar15 = r->closest;
      if ((sVar15 == 0xffffffffffffffff) || (this->m_cap <= sVar15)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4b83;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      pNVar17 = this->m_buf;
      f = pNVar17[sVar15].m_type.type | MAP;
      local_1f0 = parent;
      _check_next_flags(this,sVar15,f);
      pNVar17[sVar15].m_type.type = f;
      uVar20 = r->closest;
      sVar23 = uVar20;
      if ((uVar20 == 0xffffffffffffffff) || (this->m_cap <= uVar20)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4b83;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        parent = local_1f0;
        sVar15 = this->m_buf[uVar20].m_last_child;
        if (uVar20 == 0xffffffffffffffff) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar2 = (code *)swi(3);
            sVar15 = (*pcVar2)();
            return sVar15;
          }
          local_248.str._0_4_ = 0;
          local_248.str._4_4_ = 0;
          local_248.len._0_4_ = 0x4cb1;
          local_248.len._4_4_ = 0;
          local_238 = 0;
          uStack_234 = 0;
          uStack_230 = 0x88;
          uStack_22f = 0x42;
          uStack_22e = 0x21;
          uStack_22c = 0;
          uStack_22b = 0;
          uStack_22a = 0;
          uStack_229 = 0;
          uStack_228 = 0x65;
          uStack_227 = 0;
          uStack_226 = 0;
          uStack_225 = 0;
          uStack_224 = 0;
          uStack_222 = 0;
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks)
          ;
          sVar23 = 0xffffffffffffffff;
        }
      }
      else {
        sVar15 = this->m_buf[uVar20].m_last_child;
        parent = local_1f0;
      }
      pNVar17 = _p(this,sVar23);
      if ((((pNVar17->m_type).type & (STREAM|MAP)) == NOTYPE) &&
         (bVar14 = is_root(this,uVar20), !bVar14)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4cb2;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((sVar15 != 0xffffffffffffffff) && (pNVar17 = _p(this,sVar15), pNVar17->m_parent != uVar20)
         ) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
LAB_001d3a6f:
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4cb3;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
LAB_001d3acf:
      sVar23 = _claim(this);
      _set_hierarchy(this,sVar23,uVar20,sVar15);
    }
    else {
      sVar23 = find_child(this,sVar15,&local_1d8.value);
      if (sVar23 == 0xffffffffffffffff) {
        uVar20 = r->closest;
        pNVar17 = _p(this,uVar20);
        sVar15 = pNVar17->m_last_child;
        sVar23 = uVar20;
        if (uVar20 == 0xffffffffffffffff) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar2 = (code *)swi(3);
            sVar15 = (*pcVar2)();
            return sVar15;
          }
          local_248.str._0_4_ = 0;
          local_248.str._4_4_ = 0;
          local_248.len._0_4_ = 0x4cb1;
          local_248.len._4_4_ = 0;
          local_238 = 0;
          uStack_234 = 0;
          uStack_230 = 0x88;
          uStack_22f = 0x42;
          uStack_22e = 0x21;
          uStack_22c = 0;
          uStack_22b = 0;
          uStack_22a = 0;
          uStack_229 = 0;
          uStack_228 = 0x65;
          uStack_227 = 0;
          uStack_226 = 0;
          uStack_225 = 0;
          uStack_224 = 0;
          uStack_222 = 0;
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks)
          ;
          sVar23 = 0xffffffffffffffff;
        }
        pNVar17 = _p(this,sVar23);
        if ((((pNVar17->m_type).type & (STREAM|MAP)) == NOTYPE) &&
           (bVar14 = is_root(this,uVar20), !bVar14)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar2 = (code *)swi(3);
            sVar15 = (*pcVar2)();
            return sVar15;
          }
          local_248.str._0_4_ = 0;
          local_248.str._4_4_ = 0;
          local_248.len._0_4_ = 0x4cb2;
          local_248.len._4_4_ = 0;
          local_238 = 0;
          uStack_234 = 0;
          uStack_230 = 0x88;
          uStack_22f = 0x42;
          uStack_22e = 0x21;
          uStack_22c = 0;
          uStack_22b = 0;
          uStack_22a = 0;
          uStack_229 = 0;
          uStack_228 = 0x65;
          uStack_227 = 0;
          uStack_226 = 0;
          uStack_225 = 0;
          uStack_224 = 0;
          uStack_222 = 0;
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: is_container(parent) || is_root(parent)",0x35,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((sVar15 != 0xffffffffffffffff) &&
           (pNVar17 = _p(this,sVar15), pNVar17->m_parent != uVar20)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar2 = (code *)swi(3);
            sVar15 = (*pcVar2)();
            return sVar15;
          }
          goto LAB_001d3a6f;
        }
        goto LAB_001d3acf;
      }
    }
    if ((sVar23 == 0xffffffffffffffff) || (this->m_cap <= sVar23)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4b83;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pNVar17 = this->m_buf;
    pcVar16 = &pNVar17[sVar23].m_key.scalar;
    pcVar16->str = local_1d8.value.str;
    pcVar16->len = local_1d8.value.len;
    pNVar17[sVar23].m_val.scalar.str = "";
    pNVar17[sVar23].m_val.scalar.len = 0;
    *(undefined1 *)&pNVar17[sVar23].m_type.type = (char)pNVar17[sVar23].m_type.type | KEYVAL;
    break;
  case MAP:
  case SEQ:
    if (((char *)local_1d8.value.len != (char *)0x0) && (*local_1d8.value.str == '[')) {
      uStack_228 = 0x6e;
      uStack_227 = 0x73;
      uStack_226 = 0x5f;
      uStack_225 = 0x77;
      uStack_224 = 0x7469;
      uStack_222 = 0x2868;
      uStack_220 = 0x27;
      uStack_21f = 0x5b;
      uStack_21e = 0x292927;
      local_238 = 0x656b6f74;
      uStack_234 = 0x61762e6e;
      uStack_230 = 0x6c;
      uStack_22f = 0x75;
      uStack_22e = 0x2e65;
      uStack_22c = 0x62;
      uStack_22b = 0x65;
      uStack_22a = 0x67;
      uStack_229 = 0x69;
      local_248.str._0_4_ = 0x63656863;
      local_248.str._4_4_ = 0x6166206b;
      local_248.len._0_4_ = 0x64656c69;
      local_248.len._4_4_ = 0x2128203a;
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_58 = 0;
      uStack_50 = 0x6943;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x6943) << 0x40);
      LVar3.name.str._0_4_ = 0x214288;
      LVar3.super_LineCol.offset = auVar4._0_8_;
      LVar3.super_LineCol.line = auVar4._8_8_;
      LVar3.super_LineCol.col = auVar4._16_8_;
      LVar3.name.str._4_4_ = 0;
      LVar3.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_248,0x2e,LVar3,(this->m_callbacks).m_user_data);
    }
    uVar20 = r->closest;
    if ((uVar20 == 0xffffffffffffffff) || (this->m_cap <= uVar20)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4b86;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    uVar21 = r->closest;
    bVar14 = this->m_cap <= uVar21;
    pNVar17 = this->m_buf;
    if ((pNVar17[uVar20].m_type.type & (STREAM|MAP)) == NOTYPE) {
      if (bVar14 || uVar21 == 0xffffffffffffffff) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4b86;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar17 = this->m_buf;
      }
      sVar15 = r->closest;
      if ((pNVar17[uVar21].m_type.type & KEY) == NOTYPE) {
        to_map(this,sVar15,0);
      }
      else {
        pcVar16 = key(this,sVar15);
        to_map(this,sVar15,*pcVar16,0);
      }
    }
    else {
      if (bVar14 || uVar21 == 0xffffffffffffffff) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4b86;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar17 = this->m_buf;
      }
      if ((pNVar17[uVar21].m_type.type & MAP) == NOTYPE) {
        local_1e8.str = (char *)0xffffffffffffffff;
        cVar25.len = (size_t)&local_1e8;
        cVar25.str = (char *)sVar15;
        bVar14 = atou<unsigned_long>((c4 *)local_1d8.value.str,cVar25,
                                     (unsigned_long *)(uVar21 * 0x90));
        if (!bVar14) {
          uStack_228 = 0x75;
          uStack_227 = 0x65;
          uStack_226 = 0x2c;
          uStack_225 = 0x20;
          uStack_224 = 0x7026;
          uStack_222 = 0x736f;
          uStack_220 = 0x29;
          uStack_21f = 0;
          local_238 = 0x74613a3a;
          uStack_234 = 0x7428786f;
          uStack_230 = 0x6f;
          uStack_22f = 0x6b;
          uStack_22e = 0x6e65;
          uStack_22c = 0x2e;
          uStack_22b = 0x76;
          uStack_22a = 0x61;
          uStack_229 = 0x6c;
          local_248.str._0_4_ = 0x63656863;
          local_248.str._4_4_ = 0x6166206b;
          local_248.len._0_4_ = 0x64656c69;
          local_248.len._4_4_ = 0x3463203a;
          if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar2 = (code *)swi(3);
            sVar15 = (*pcVar2)();
            return sVar15;
          }
          local_80 = 0;
          uStack_78 = 0x6953;
          local_70 = 0;
          pcStack_68 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_60 = 0x65;
          auVar4 = ZEXT1224(ZEXT412(0x6953) << 0x40);
          LVar5.name.str._0_4_ = 0x214288;
          LVar5.super_LineCol.offset = auVar4._0_8_;
          LVar5.super_LineCol.line = auVar4._8_8_;
          LVar5.super_LineCol.col = auVar4._16_8_;
          LVar5.name.str._4_4_ = 0;
          LVar5.name.len = 0x65;
          (*(this->m_callbacks).m_error)
                    ((char *)&local_248,0x2a,LVar5,(this->m_callbacks).m_user_data);
        }
        if (local_1e8.str == (char *)0xffffffffffffffff) {
          local_238 = 0x2120736f;
          uStack_234 = 0x4f4e203d;
          uStack_230 = 0x4e;
          uStack_22f = 0x45;
          uStack_22e = 0x29;
          local_248.str._0_4_ = 0x63656863;
          local_248.str._4_4_ = 0x6166206b;
          local_248.len._0_4_ = 0x64656c69;
          local_248.len._4_4_ = 0x7028203a;
          if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar2 = (code *)swi(3);
            sVar15 = (*pcVar2)();
            return sVar15;
          }
          local_a8 = 0;
          uStack_a0 = 0x6954;
          local_98 = 0;
          pcStack_90 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_88 = 0x65;
          auVar4 = ZEXT1224(ZEXT412(0x6954) << 0x40);
          LVar6.name.str._0_4_ = 0x214288;
          LVar6.super_LineCol.offset = auVar4._0_8_;
          LVar6.super_LineCol.line = auVar4._8_8_;
          LVar6.super_LineCol.col = auVar4._16_8_;
          LVar6.name.str._4_4_ = 0;
          LVar6.name.len = 0x65;
          (*(this->m_callbacks).m_error)
                    ((char *)&local_248,0x1c,LVar6,(this->m_callbacks).m_user_data);
        }
        sVar23 = child(this,r->closest,(size_t)local_1e8.str);
      }
      else {
        sVar23 = find_child(this,r->closest,&local_1d8.value);
      }
      if (sVar23 != 0xffffffffffffffff) goto LAB_001d3c4a;
    }
    uVar20 = r->closest;
    if ((uVar20 == 0xffffffffffffffff) || (this->m_cap <= uVar20)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4b86;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[uVar20].m_type.type & MAP) == NOTYPE) {
      local_238 = 0x616d5f73;
      uStack_234 = 0x2d722870;
      uStack_230 = 0x3e;
      uStack_22f = 99;
      uStack_22e = 0x6f6c;
      uStack_22c = 0x73;
      uStack_22b = 0x65;
      uStack_22a = 0x73;
      local_248.str._0_4_ = 0x63656863;
      local_248.str._4_4_ = 0x6166206b;
      local_248.len._0_4_ = 0x64656c69;
      local_248.len._4_4_ = 0x6928203a;
      uStack_229 = 0x74;
      uStack_228 = 0x29;
      uStack_227 = 0x29;
      uStack_226 = 0;
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_d0 = 0;
      uStack_c8 = 0x695a;
      local_c0 = 0;
      pcStack_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_b0 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x695a) << 0x40);
      LVar10.name.str._0_4_ = 0x214288;
      LVar10.super_LineCol.offset = auVar4._0_8_;
      LVar10.super_LineCol.line = auVar4._8_8_;
      LVar10.super_LineCol.col = auVar4._16_8_;
      LVar10.name.str._4_4_ = 0;
      LVar10.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_248,0x23,LVar10,(this->m_callbacks).m_user_data)
      ;
    }
    sVar15 = r->closest;
    uVar20 = this->m_cap;
    if (sVar15 < uVar20 && sVar15 != 0xffffffffffffffff) {
      pNVar17 = this->m_buf;
      uVar21 = pNVar17[sVar15].m_last_child;
LAB_001d2b81:
      if (uVar20 <= sVar15) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4b86;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar17 = this->m_buf;
      }
      uVar1 = (undefined1)pNVar17[sVar15].m_type.type;
    }
    else {
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4b83;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pNVar17 = this->m_buf;
      uVar21 = pNVar17[sVar15].m_last_child;
      if (sVar15 != 0xffffffffffffffff) {
        uVar20 = this->m_cap;
        goto LAB_001d2b81;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4cb1;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4b86;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      uVar1 = (undefined1)this->m_buf[-1].m_type.type;
    }
    if (((uVar1 & (STREAM|MAP)) == NOTYPE) && (bVar14 = is_root(this,sVar15), !bVar14)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4cb2;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (uVar21 != 0xffffffffffffffff) {
      if (this->m_cap <= uVar21) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4b83;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (this->m_buf[uVar21].m_parent != sVar15) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (*pcVar2)();
          return sVar15;
        }
        local_248.str._0_4_ = 0;
        local_248.str._4_4_ = 0;
        local_248.len._0_4_ = 0x4cb3;
        local_248.len._4_4_ = 0;
        local_238 = 0;
        uStack_234 = 0;
        uStack_230 = 0x88;
        uStack_22f = 0x42;
        uStack_22e = 0x21;
        uStack_22c = 0;
        uStack_22b = 0;
        uStack_22a = 0;
        uStack_229 = 0;
        uStack_228 = 0x65;
        uStack_227 = 0;
        uStack_226 = 0;
        uStack_225 = 0;
        uStack_224 = 0;
        uStack_222 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    sVar23 = _claim(this);
    _set_hierarchy(this,sVar23,sVar15,uVar21);
    if ((sVar23 == 0xffffffffffffffff) || (this->m_cap <= sVar23)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        sVar15 = (*pcVar2)();
        return sVar15;
      }
      local_248.str._0_4_ = 0;
      local_248.str._4_4_ = 0;
      local_248.len._0_4_ = 0x4b83;
      local_248.len._4_4_ = 0;
      local_238 = 0;
      uStack_234 = 0;
      uStack_230 = 0x88;
      uStack_22f = 0x42;
      uStack_22e = 0x21;
      uStack_22c = 0;
      uStack_22b = 0;
      uStack_22a = 0;
      uStack_229 = 0;
      uStack_228 = 0x65;
      uStack_227 = 0;
      uStack_226 = 0;
      uStack_225 = 0;
      uStack_224 = 0;
      uStack_222 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pNVar17 = this->m_buf;
    pcVar16 = &pNVar17[sVar23].m_key.scalar;
    pcVar16->str = local_1d8.value.str;
    pcVar16->len = local_1d8.value.len;
    pNVar17 = pNVar17 + sVar23;
    *(undefined1 *)&(pNVar17->m_type).type = (char)(pNVar17->m_type).type | KEY;
  }
  if (sVar23 == 0xffffffffffffffff) {
    local_238 = 0x2065646f;
    uStack_234 = 0x4e203d21;
    uStack_230 = 0x4f;
    uStack_22f = 0x4e;
    uStack_22e = 0x2945;
    uStack_22c = 0;
    local_248.str._0_4_ = 0x63656863;
    local_248.str._4_4_ = 0x6166206b;
    local_248.len._0_4_ = 0x64656c69;
    local_248.len._4_4_ = 0x6e28203a;
    if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar2 = (code *)swi(3);
      sVar15 = (*pcVar2)();
      return sVar15;
    }
    local_1c0 = 0;
    uStack_1b8 = 0x69a1;
    local_1b0 = 0;
    pcStack_1a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_1a0 = 0x65;
    auVar4 = ZEXT1224(ZEXT412(0x69a1) << 0x40);
    LVar13.name.str._0_4_ = 0x214288;
    LVar13.super_LineCol.offset = auVar4._0_8_;
    LVar13.super_LineCol.line = auVar4._8_8_;
    LVar13.super_LineCol.col = auVar4._16_8_;
    LVar13.name.str._4_4_ = 0;
    LVar13.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_248,0x1d,LVar13,(this->m_callbacks).m_user_data);
    sVar23 = 0xffffffffffffffff;
  }
LAB_001d3c4a:
  (parent->type).type = local_1d8.type.type;
  (parent->value).str = local_1d8.value.str;
  (parent->value).len = local_1d8.value.len;
switchD_001d1f12_caseD_0:
  return sVar23;
}

Assistant:

size_t Tree::_next_node_modify(lookup_result * r, _lookup_path_token *parent)
{
    _lookup_path_token token = _next_token(r, *parent);
    if( ! token)
        return NONE;

    size_t node = NONE;
    if(token.type == MAP || token.type == SEQ)
    {
        _RYML_CB_ASSERT(m_callbacks, !token.value.begins_with('['));
        //_RYML_CB_ASSERT(m_callbacks, is_container(r->closest) || r->closest == NONE);
        if( ! is_container(r->closest))
        {
            if(has_key(r->closest))
                to_map(r->closest, key(r->closest));
            else
                to_map(r->closest);
        }
        else
        {
            if(is_map(r->closest))
                node = find_child(r->closest, token.value);
            else
            {
                size_t pos = NONE;
                _RYML_CB_CHECK(m_callbacks, c4::atox(token.value, &pos));
                _RYML_CB_ASSERT(m_callbacks, pos != NONE);
                node = child(r->closest, pos);
            }
        }
        if(node == NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, is_map(r->closest));
            node = append_child(r->closest);
            NodeData *n = _p(node);
            n->m_key.scalar = token.value;
            n->m_type.add(KEY);
        }
    }
    else if(token.type == KEYVAL)
    {
        _RYML_CB_ASSERT(m_callbacks, r->unresolved().empty());
        if(is_map(r->closest))
        {
            node = find_child(r->closest, token.value);
            if(node == NONE)
                node = append_child(r->closest);
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, !is_seq(r->closest));
            _add_flags(r->closest, MAP);
            node = append_child(r->closest);
        }
        NodeData *n = _p(node);
        n->m_key.scalar = token.value;
        n->m_val.scalar = "";
        n->m_type.add(KEYVAL);
    }
    else if(token.type == KEY)
    {
        _RYML_CB_ASSERT(m_callbacks, token.value.begins_with('[') && token.value.ends_with(']'));
        token.value = token.value.offs(1, 1).trim(' ');
        size_t idx;
        if( ! from_chars(token.value, &idx))
             return NONE;
        if( ! is_container(r->closest))
        {
            if(has_key(r->closest))
            {
                csubstr k = key(r->closest);
                _clear_type(r->closest);
                to_seq(r->closest, k);
            }
            else
            {
                _clear_type(r->closest);
                to_seq(r->closest);
            }
        }
        _RYML_CB_ASSERT(m_callbacks, is_container(r->closest));
        node = child(r->closest, idx);
        if(node == NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, num_children(r->closest) <= idx);
            for(size_t i = num_children(r->closest); i <= idx; ++i)
            {
                node = append_child(r->closest);
                if(i < idx)
                {
                    if(is_map(r->closest))
                        to_keyval(node, /*"~"*/{}, /*"~"*/{});
                    else if(is_seq(r->closest))
                        to_val(node, /*"~"*/{});
                }
            }
        }
    }
    else
    {
        C4_NEVER_REACH();
    }

    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    *parent = token;
    return node;
}